

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
MXNetNode::attr_ai(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  long lVar5;
  int nconsumed;
  int i;
  int local_54;
  key_type local_50;
  
  std::__cxx11::string::string((string *)&local_50,key,(allocator *)&local_54);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p));
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_Rb_tree_header *)cVar4._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = is_attr_scalar(this,key);
    if (bVar2) {
      local_50._M_dataplus._M_p._0_4_ = attr_i(this,key);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,(int *)&local_50);
      }
      else {
        *iVar1._M_current = (int)local_50._M_dataplus._M_p;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = 0;
      local_54 = 0;
      iVar3 = __isoc99_sscanf(*(undefined8 *)(cVar4._M_node + 2),"%*[\\[(,]%d%n");
      if (iVar3 != 1) {
        iVar3 = strncmp(*(char **)(cVar4._M_node + 2),"(None",5);
        if (iVar3 != 0) {
          return __return_storage_ptr__;
        }
        local_50._M_dataplus._M_p._0_4_ = -0xe9;
        local_54 = 5;
      }
      lVar5 = 0;
      while( true ) {
        do {
          iVar1._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,
                       (int *)&local_50);
          }
          else {
            *iVar1._M_current = (int)local_50._M_dataplus._M_p;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          local_50._M_dataplus._M_p._0_4_ = 0;
          lVar5 = (long)(int)lVar5 + (long)local_54;
          iVar3 = __isoc99_sscanf(*(long *)(cVar4._M_node + 2) + lVar5,"%*[(,]%d%n",&local_50,
                                  &local_54);
        } while (iVar3 == 1);
        iVar3 = strncmp((char *)(lVar5 + *(long *)(cVar4._M_node + 2)),", None",6);
        if (iVar3 != 0) break;
        local_50._M_dataplus._M_p._0_4_ = -0xe9;
        local_54 = 6;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    if (is_attr_scalar(key))
    {
        list.push_back(attr_i(key));
        return list;
    }

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[\\[(,]%d%n", &i, &nconsumed);
    if (nscan != 1)
    {
        // (None
        if (strncmp(it->second.c_str() + c, "(None", 5) == 0)
        {
            i = -233;
            nconsumed = 5;
            nscan = 1;
        }
    }
    while (nscan == 1)
    {
        list.push_back(i);
        //         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
        if (nscan != 1)
        {
            // , None
            if (strncmp(it->second.c_str() + c, ", None", 6) == 0)
            {
                i = -233;
                nconsumed = 6;
                nscan = 1;
            }
        }
    }

    return list;
}